

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<void_(double,_double,_mp::var::Type)>::Matches
          (OnCallSpec<void_(double,_double,_mp::var::Type)> *this,ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<3ul>::
          Matches<std::tuple<testing::Matcher<double>,testing::Matcher<double>,testing::Matcher<mp::var::Type>>,std::tuple<double,double,mp::var::Type>>
                    ((tuple<testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                      *)(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<double,_double,_mp::var::Type>_&>::Matches
                      ((MatcherBase<const_std::tuple<double,_double,_mp::var::Type>_&> *)
                       (this + 0x58),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }